

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

void __thiscall net_uv::KCPSocket::checkLogic(KCPSocket *this)

{
  uint uVar1;
  uint32_t uVar2;
  IUINT32 IVar3;
  uint64_t uVar4;
  KCPSocket *pKVar5;
  uint32_t value;
  uint32_t value_00;
  uint32_t conv;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  KCPSocket *local_10;
  KCPSocket *this_local;
  
  local_10 = this;
  switch(this->m_kcpState) {
  case LISTEN:
    break;
  case STOP_LISTEN:
    uVar2 = KCPSocketManager::count(this->m_socketMng);
    if (uVar2 == 0) {
      shutdownSocket(this);
    }
    else {
      KCPSocketManager::disconnectAll(this->m_socketMng);
    }
    break;
  case SYN_SENT:
    uVar4 = uv_now((this->super_Socket).m_loop);
    if (uVar4 - this->m_stateTimeStamp < 0xbb9) {
      kcp_making_syn_abi_cxx11_(&local_30,(net_uv *)(ulong)(uint)this->m_randValue,value);
      udpSendStr(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
      connectResult(this,2);
    }
    break;
  case SYN_RECV:
    uVar4 = uv_now((this->super_Socket).m_loop);
    if (uVar4 - this->m_stateTimeStamp < 0x1389) {
      uVar1 = this->m_randValue;
      pKVar5 = this;
      IVar3 = getConv(this);
      kcp_making_syn_and_ack_abi_cxx11_(&local_60,(net_uv *)(ulong)uVar1,IVar3,(uint32_t)pKVar5);
      udpSendStr(this,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      acceptFailed(this);
    }
    break;
  case ESTABLISHED:
    if ((this->m_soType == CLI_SO) &&
       (uVar4 = uv_now((this->super_Socket).m_loop), uVar4 - this->m_stateTimeStamp < 2000)) {
      IVar3 = getConv(this);
      kcp_making_ack_abi_cxx11_(&local_80,(net_uv *)(ulong)(IVar3 + 1),value_00);
      udpSendStr(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    break;
  case FIN_WAIT:
  case CLOSE_WAIT:
    uVar4 = uv_now((this->super_Socket).m_loop);
    if (uVar4 - this->m_stateTimeStamp < 0x3e9) {
      IVar3 = getConv(this);
      kcp_making_fin_abi_cxx11_(&local_a0,(net_uv *)(ulong)IVar3,conv);
      udpSendStr(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      shutdownSocket(this);
    }
    break;
  default:
    shutdownSocket(this);
  }
  if ((this->m_kcpState == ESTABLISHED) &&
     (uVar4 = uv_now((this->super_Socket).m_loop), 6000 < uVar4 - this->m_lastKcpRecvTime)) {
    this->m_heartbeatLoseCount = this->m_heartbeatLoseCount + 1;
    uVar4 = uv_now((this->super_Socket).m_loop);
    this->m_lastKcpRecvTime = uVar4;
    if (this->m_heartbeatLoseCount < 10) {
      if (this->m_soType == CLI_SO) {
        if (1 < this->m_heartbeatLoseCount) {
          kcp_making_heart_packet_abi_cxx11_();
          udpSendStr(this,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      else if (4 < this->m_heartbeatLoseCount) {
        kcp_making_heart_packet_abi_cxx11_();
        udpSendStr(this,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
    }
    else {
      (*(this->super_Socket)._vptr_Socket[7])();
    }
  }
  return;
}

Assistant:

void KCPSocket::checkLogic()
{
	switch (m_kcpState)
	{
	case State::LISTEN:
		break;
	case State::STOP_LISTEN:
	{
		if (m_socketMng->count() <= 0)
			shutdownSocket();
		else
			m_socketMng->disconnectAll();
	}
	break;
	case State::SYN_SENT:
	{
		// connect timeout
		if (uv_now(m_loop) - m_stateTimeStamp > 3000)
			this->connectResult(2);
		else
			this->udpSendStr(kcp_making_syn(m_randValue));
	}
	break;
	case State::SYN_RECV:
	{
		if (uv_now(m_loop) - m_stateTimeStamp > 5000)
			this->acceptFailed();
		else
			this->udpSendStr(kcp_making_syn_and_ack(m_randValue, this->getConv()));
	}
	break;
	case State::ESTABLISHED:
	{
		if (m_soType == KCPSOType::CLI_SO && uv_now(m_loop) - m_stateTimeStamp < 2000)
			this->udpSendStr(kcp_making_ack(this->getConv() + 1));
	}
	break;
	case State::FIN_WAIT:
	case State::CLOSE_WAIT:
		if (uv_now(m_loop) - m_stateTimeStamp > 1000)
			this->shutdownSocket();
		else
			this->udpSendStr(kcp_making_fin(getConv()));
		break;
	default:
		this->shutdownSocket();
		break;
	}

	if (m_kcpState == State::ESTABLISHED && uv_now(m_loop) - m_lastKcpRecvTime > 6000U)
	{
		m_heartbeatLoseCount++;
		m_lastKcpRecvTime = uv_now(m_loop);

		// If there is no message communication more than one minute
		if (m_heartbeatLoseCount > 9)
		{
			this->disconnect();
			return;
		}

		if (m_soType == CLI_SO)
		{
			if (m_heartbeatLoseCount >= 2)
				this->udpSendStr(kcp_making_heart_packet());
		}
		else
		{
			if (m_heartbeatLoseCount >= 5)
				this->udpSendStr(kcp_making_heart_packet());
		}
	}
}